

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineContinuity
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  int *piVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  char *local_248 [3];
  MessageBuilder local_230;
  undefined1 local_ac [16];
  undefined1 local_9c [16];
  Vector<int,_2> local_8c;
  IVec2 cursorNeighborNeg;
  IVec2 cursorNeighborPos;
  Vector<int,_2> local_74;
  IVec2 advanceNeighbor;
  bool hit;
  IVec2 cursor;
  int iStack_48;
  deUint8 errorMask;
  int totalPixels;
  int missedPixels;
  IVec2 advance;
  bool line;
  int *messageLimitCounter_local;
  int componentNdx_local;
  IVec2 *end_local;
  IVec2 *begin_local;
  ConstPixelBufferAccess *access_local;
  LineRenderCase *this_local;
  
  advance.m_data[0]._3_1_ = 0;
  unique0x10000462 = messageLimitCounter;
  iVar2 = tcu::Vector<int,_2>::x(begin);
  iVar3 = tcu::Vector<int,_2>::x(end);
  if (iVar2 == iVar3) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&totalPixels,0,1);
  }
  else {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&totalPixels,1,0);
  }
  iStack_48 = 0;
  cursor.m_data[1] = 0;
  cursor.m_data[0]._3_1_ = '\0';
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffa8,begin);
  while (bVar1 = tcu::Vector<int,_2>::operator!=((Vector<int,_2> *)&stack0xffffffffffffffa8,end),
        bVar1) {
    piVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffa8);
    iVar2 = *piVar6;
    piVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffa8);
    iVar3 = (int)access;
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)&advanceNeighbor,iVar3,iVar2,*piVar6);
    piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&advanceNeighbor,componentNdx);
    if (*piVar6 == 0) {
      if (((advance.m_data[0]._3_1_ & 1) != 0) && (*piVar6 == 0)) {
        tcu::Vector<int,_2>::Vector(&cursorNeighborPos,1,1);
        tcu::operator-((tcu *)&local_74,&cursorNeighborPos,(Vector<int,_2> *)&totalPixels);
        tcu::operator+((tcu *)&cursorNeighborNeg,(Vector<int,_2> *)&stack0xffffffffffffffa8,
                       &local_74);
        tcu::operator-((tcu *)&local_8c,(Vector<int,_2> *)&stack0xffffffffffffffa8,&local_74);
        iVar2 = tcu::Vector<int,_2>::x(&cursorNeighborNeg);
        iVar4 = tcu::Vector<int,_2>::y(&cursorNeighborNeg);
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_9c,iVar3,iVar2,iVar4);
        piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_9c,componentNdx);
        bVar1 = false;
        if (*piVar6 == 0) {
          iVar2 = tcu::Vector<int,_2>::x(&local_8c);
          iVar4 = tcu::Vector<int,_2>::y(&local_8c);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_ac,iVar3,iVar2,iVar4);
          piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_ac,componentNdx);
          bVar1 = *piVar6 == 0;
        }
        if (bVar1) {
          iStack_48 = iStack_48 + 1;
        }
      }
    }
    else {
      advance.m_data[0]._3_1_ = 1;
    }
    cursor.m_data[1] = cursor.m_data[1] + 1;
    tcu::Vector<int,_2>::operator+=
              ((Vector<int,_2> *)&stack0xffffffffffffffa8,(Vector<int,_2> *)&totalPixels);
  }
  if ((0 < iStack_48) &&
     (iVar2 = *stack0xffffffffffffffc8, *stack0xffffffffffffffc8 = iVar2 + -1, -1 < iVar2 + -1)) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_230,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [22])"Found non-continuous ");
    iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&totalPixels);
    local_248[0] = "uni_atom_vertical";
    if (iVar2 == 1) {
      local_248[0] = "uni_atom_horizontal";
    }
    local_248[0] = local_248[0] + 9;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_248);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])" line near ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,begin);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2b17bfb);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])"Missed pixels: ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xffffffffffffffb8);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_230);
    iVar2 = iStack_48;
    dVar5 = ::deRoundFloatToInt32((float)cursor.m_data[1] * 0.1);
    if (dVar5 < iVar2) {
      cursor.m_data[0]._3_1_ = ' ';
    }
    else {
      cursor.m_data[0]._3_1_ = '@';
    }
  }
  return cursor.m_data[0]._3_1_;
}

Assistant:

deUint8 LineRenderCase::checkLineContinuity (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	bool				line					= false;
	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	int					missedPixels			= 0;
	int					totalPixels				= 0;
	deUint8				errorMask				= 0;

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			line = true;
		else if (line && !hit)
		{
			// non-continuous line detected
			const tcu::IVec2 advanceNeighbor	= tcu::IVec2(1, 1) - advance;
			const tcu::IVec2 cursorNeighborPos	= cursor + advanceNeighbor;
			const tcu::IVec2 cursorNeighborNeg	= cursor - advanceNeighbor;
			// hw precision issues may lead to a line being non-straight -> check neighboring pixels
			if ((access.getPixelInt(cursorNeighborPos.x(), cursorNeighborPos.y())[componentNdx] == 0) && (access.getPixelInt(cursorNeighborNeg.x(), cursorNeighborNeg.y())[componentNdx] == 0))
				++missedPixels;
		}
		++totalPixels;
	}

	if (missedPixels > 0 && --messageLimitCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Found non-continuous " << ((advance.x() == 1)  ? ("horizontal") : ("vertical")) << " line near " << begin << ". "
			<< "Missed pixels: " << missedPixels
			<< tcu::TestLog::EndMessage;
		// allow 10% missing pixels for warning
		if (missedPixels <= deRoundFloatToInt32((float)totalPixels * 0.1f))
			errorMask = SCANRESULT_LINE_CONT_WARN_BIT;
		else
			errorMask =  SCANRESULT_LINE_CONT_ERR_BIT;
	}

	return errorMask;
}